

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_to_string.h
# Opt level: O0

string * cute::cute_to_string::backslashQuoteTabNewline
                   (string *__return_storage_ptr__,string *input)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong local_38;
  size_type i;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_38 = 0; uVar2 = std::__cxx11::string::length(), local_38 < uVar2;
      local_38 = local_38 + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
    cVar1 = *pcVar3;
    if (cVar1 == '\t') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\t");
    }
    else if (cVar1 == '\n') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\n");
    }
    else if (cVar1 == '\r') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\r");
    }
    else if (cVar1 == '\\') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\\\\");
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)input);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string backslashQuoteTabNewline(std::string const &input){
			std::string result;
			result.reserve(input.size());
			for (std::string::size_type i=0; i < input.length() ; ++i){
				switch(input[i]) {
					case '\n': result += "\\n"; break;
					case '\t': result += "\\t"; break;
					case '\\': result += "\\\\"; break;
					case '\r': result += "\\r"; break;
					default: result += input[i];
				}
			}
			return result;
		}